

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

MatrixXd * __thiscall ChebTools::LMatrixLibrary::get(LMatrixLibrary *this,size_t N)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  p_Var4 = (this->matrices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->matrices)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(p_Var4 + 1) >= N) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < N];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && (*(ulong *)(p_Var2 + 1) <= N)) goto LAB_0010aa35;
  }
  build(this,N);
  p_Var4 = (this->matrices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  p_Var2 = &p_Var1->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      if (*(ulong *)(p_Var4 + 1) >= N) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < N];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(ulong *)(p_Var3 + 1) <= N)) {
      p_Var2 = p_Var3;
    }
  }
LAB_0010aa35:
  return (MatrixXd *)&p_Var2[1]._M_parent;
}

Assistant:

const Eigen::MatrixXd & get(std::size_t N) {
            auto it = matrices.find(N);
            if (it != matrices.end()) {
                return it->second;
            }
            else {
                build(N);
                return matrices.find(N)->second;
            }
        }